

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpersTest.cpp
# Opt level: O0

void __thiscall AppHelper_Ofstream_Test::TestBody(AppHelper_Ofstream_Test *this)

{
  bool bVar1;
  string *psVar2;
  ostream *this_00;
  char *pcVar3;
  char *in_R9;
  string local_358;
  AssertHelper local_338;
  Message local_330;
  string local_328;
  bool local_301;
  undefined1 local_300 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_2d0;
  Message local_2c8;
  string local_2c0;
  bool local_299;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_;
  ofstream out;
  string local_88;
  undefined1 local_68 [8];
  TempFile myfile;
  allocator local_31;
  undefined1 local_30 [8];
  string name;
  AppHelper_Ofstream_Test *this_local;
  
  name.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"TestFileNotUsed.txt",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string((string *)&local_88,(string *)local_30);
  TempFile::TempFile((TempFile *)local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  psVar2 = TempFile::operator_cast_to_string_((TempFile *)local_68);
  std::ofstream::ofstream(&gtest_ar_.message_,psVar2,0x10);
  this_00 = std::operator<<((ostream *)&gtest_ar_.message_,"this is output");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(&gtest_ar_.message_);
  psVar2 = TempFile::operator_cast_to_string_((TempFile *)local_68);
  CLI::ExistingFile(&local_2c0,psVar2);
  local_299 = (bool)std::__cxx11::string::empty();
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_298,&local_299,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_2c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_298,
               (AssertionResult *)"CLI::ExistingFile(myfile).empty()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/HelpersTest.cpp"
               ,0xad,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  TempFile::~TempFile((TempFile *)local_68);
  CLI::ExistingFile(&local_328,(string *)local_30);
  local_301 = (bool)std::__cxx11::string::empty();
  local_301 = (bool)(local_301 ^ 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_300,&local_301,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_328);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_358,(internal *)local_300,(AssertionResult *)"CLI::ExistingFile(name).empty()"
               ,"true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/HelpersTest.cpp"
               ,0xaf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_338,&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    std::__cxx11::string::~string((string *)&local_358);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(AppHelper, Ofstream) {

    std::string name = "TestFileNotUsed.txt";
    {
        TempFile myfile(name);

        {
            std::ofstream out{myfile};
            out << "this is output" << std::endl;
        }

        EXPECT_TRUE(CLI::ExistingFile(myfile).empty());
    }
    EXPECT_FALSE(CLI::ExistingFile(name).empty());
}